

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void parse_preshader(Context *ctx,uint32 *tokens,uint32 tokcount)

{
  uint32 okay_version;
  uint uVar1;
  MOJOSHADER_malloc p_Var2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  MOJOSHADER_symbol *pMVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  MOJOSHADER_preshader *pMVar17;
  double *pdVar18;
  MOJOSHADER_preshaderInstruction *__s;
  ulong uVar19;
  uint *puVar20;
  float *__s_00;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  char *pcVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  MOJOSHADER_preshaderOpcode MVar30;
  MOJOSHADER_preshaderOperand *pMVar31;
  bool bVar32;
  CtabData ctabdata;
  uint local_ac;
  uint local_9c;
  uint *local_88;
  uint local_74;
  uint *local_70;
  MOJOSHADER_preshaderInstruction *local_68;
  uint *local_60;
  uint *local_58;
  CtabData local_48;
  
  if (ctx->have_preshader != 0) {
    __assert_fail("ctx->have_preshader == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x29c0,"void parse_preshader(Context *, const uint32 *, uint32)");
  }
  ctx->have_preshader = 1;
  okay_version = *tokens;
  if (okay_version + 0xb9a7fdfe < 0xfffffffe) {
    pcVar24 = "Unsupported preshader version.";
  }
  else {
    uVar25 = tokcount - 1;
    bVar8 = false;
    local_ac = 0;
    local_58 = (uint *)0x0;
    bVar7 = false;
    local_9c = 0;
    local_88 = (uint *)0x0;
    bVar5 = false;
    local_74 = 0;
    local_70 = (uint *)0x0;
    bVar32 = false;
    local_68 = (MOJOSHADER_preshaderInstruction *)0x0;
    local_60 = (uint *)0x0;
    puVar20 = tokens + 1;
    while (uVar25 != 0) {
      uVar21 = *puVar20;
      uVar23 = 0;
      if ((uVar21 & 0xffff) == 0xfffe) {
        if ((int)uVar21 < 0) {
          failf(ctx,"%s","comment token high bit must be zero.");
        }
        uVar23 = (ulong)(uVar21 >> 0x10);
      }
      uVar13 = (uint)uVar23;
      bVar6 = bVar5;
      bVar9 = bVar8;
      if (uVar25 < uVar13 || (uVar21 & 0xffff) != 0xfffe) {
        pcVar24 = "Bogus preshader data.";
        goto LAB_0010bb5d;
      }
      uVar25 = uVar25 - 1;
      puVar16 = puVar20 + uVar23 + 1;
      uVar21 = uVar25 - uVar13;
      bVar4 = true;
      if (uVar13 != 0) {
        puVar20 = puVar20 + 1;
        uVar29 = *puVar20;
        if ((int)uVar29 < 0x49535250) {
          if (uVar29 == 0x42415443) {
            pcVar24 = "Multiple CTAB preshader blocks.";
            bVar10 = !bVar32;
            bVar32 = true;
            if (bVar10) {
              bVar32 = true;
              local_68 = (MOJOSHADER_preshaderInstruction *)uVar23;
              local_60 = puVar20;
              goto LAB_0010bc8c;
            }
          }
          else if (uVar29 == 0x434c5846) {
            pcVar24 = "Multiple FXLC preshader blocks.";
            bVar10 = !bVar7;
            bVar7 = true;
            if (bVar10) {
              bVar7 = true;
              local_9c = uVar13;
              local_88 = puVar20;
              goto LAB_0010bc8c;
            }
          }
          else {
LAB_0010bc2d:
            pcVar24 = "Bogus preshader section.";
          }
LAB_0010bb5d:
          puVar16 = puVar20;
          bVar4 = false;
          failf(ctx,"%s",pcVar24);
          uVar21 = uVar25;
          bVar5 = bVar6;
          bVar8 = bVar9;
        }
        else if (uVar29 == 0x49535250) {
          pcVar24 = "Multiple PRSI preshader blocks.";
          bVar6 = true;
          if (bVar5) goto LAB_0010bb5d;
          bVar5 = true;
          local_74 = uVar13;
          local_70 = puVar20;
        }
        else {
          if (uVar29 != 0x54494c43) goto LAB_0010bc2d;
          pcVar24 = "Multiple CLIT preshader blocks.";
          bVar9 = true;
          if (bVar8) goto LAB_0010bb5d;
          bVar8 = true;
          local_ac = uVar13;
          local_58 = puVar20;
        }
      }
LAB_0010bc8c:
      uVar25 = uVar21;
      puVar20 = puVar16;
      if (!bVar4) {
        return;
      }
    }
    if (bVar32) {
      if (bVar7) {
        if (bVar8) {
          pMVar17 = (MOJOSHADER_preshader *)(*ctx->malloc)(0x58,ctx->malloc_data);
          if (pMVar17 == (MOJOSHADER_preshader *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
            return;
          }
          pMVar17->malloc = (MOJOSHADER_malloc)0x0;
          pMVar17->free = (MOJOSHADER_free)0x0;
          *(undefined8 *)&pMVar17->register_count = 0;
          pMVar17->registers = (float *)0x0;
          *(undefined8 *)&pMVar17->instruction_count = 0;
          pMVar17->instructions = (MOJOSHADER_preshaderInstruction *)0x0;
          pMVar17->temp_count = 0;
          pMVar17->symbol_count = 0;
          pMVar17->symbols = (MOJOSHADER_symbol *)0x0;
          *(undefined8 *)pMVar17 = 0;
          pMVar17->literals = (double *)0x0;
          pMVar17->malloc_data = (void *)0x0;
          p_Var2 = ctx->malloc;
          pMVar17->malloc = p_Var2;
          pMVar17->free = ctx->free;
          pvVar3 = ctx->malloc_data;
          pMVar17->malloc_data = pvVar3;
          ctx->preshader = pMVar17;
          if (local_ac == 0) {
            failf(ctx,"%s","Bogus CLIT block in preshader.");
          }
          else {
            uVar25 = local_58[1];
            if (local_ac - 2 >> 1 < uVar25) {
              pcVar24 = "Bogus CLIT block in preshader.";
              goto LAB_0010ba71;
            }
            if (uVar25 != 0) {
              pMVar17->literal_count = uVar25;
              pdVar18 = (double *)(*p_Var2)(uVar25 * 8,pvVar3);
              if (pdVar18 == (double *)0x0) {
                ctx->isfail = 1;
                ctx->out_of_memory = 1;
                pMVar17->literals = (double *)0x0;
                return;
              }
              pMVar17->literals = pdVar18;
              uVar23 = 0;
              do {
                pdVar18[uVar23] = *(double *)(local_58 + uVar23 * 2 + 2);
                uVar23 = uVar23 + 1;
              } while (uVar25 != uVar23);
            }
          }
          if (bVar5) {
            if ((local_74 < 8) || (uVar25 = local_70[7], local_74 - 8 < uVar25 * 2 + 2)) {
              pcVar24 = "Bogus preshader PRSI data";
              goto LAB_0010ba71;
            }
            local_70 = local_70 + 8;
          }
          else {
            uVar25 = 0;
            local_70 = (uint *)0x0;
          }
          local_48.have_ctab = 0;
          local_48.symbol_count = 0;
          local_48.symbols = (MOJOSHADER_symbol *)0x0;
          parse_constant_table(ctx,local_60 + -1,(int)local_68 << 2,okay_version,0,&local_48);
          pMVar12 = local_48.symbols;
          iVar11 = local_48.symbol_count;
          pMVar17->symbol_count = local_48.symbol_count;
          pMVar17->symbols = local_48.symbols;
          if (local_48.have_ctab == 0) {
            pcVar24 = "Bogus preshader CTAB data";
          }
          else {
            uVar21 = local_88[1];
            uVar23 = (ulong)uVar21;
            pMVar17->instruction_count = uVar21;
            __s = (MOJOSHADER_preshaderInstruction *)
                  (*ctx->malloc)((int)(uVar23 * 0x70),ctx->malloc_data);
            if (__s == (MOJOSHADER_preshaderInstruction *)0x0) {
              ctx->isfail = 1;
              ctx->out_of_memory = 1;
            }
            pMVar17->instructions = __s;
            if (__s == (MOJOSHADER_preshaderInstruction *)0x0) {
              return;
            }
            memset(__s,0,uVar23 * 0x70);
            local_9c = local_9c - 2;
            if (uVar21 <= local_9c >> 1) {
              uVar27 = (ulong)uVar25;
              local_88 = local_88 + 2;
              local_68 = pMVar17->instructions;
              do {
                iVar28 = (int)uVar23;
                uVar23 = (ulong)(iVar28 - 1);
                if (iVar28 == 0) {
                  uVar25 = pMVar17->symbol_count;
                  pMVar17->temp_count = pMVar17->temp_count + 3 & 0xfffffffc;
                  if (uVar25 == 0) {
                    uVar21 = 0;
                  }
                  else {
                    puVar20 = &pMVar17->symbols->register_count;
                    uVar21 = 0;
                    do {
                      if (uVar21 < *puVar20 + puVar20[-1]) {
                        uVar21 = *puVar20 + puVar20[-1];
                      }
                      puVar20 = puVar20 + 0xe;
                      uVar25 = uVar25 - 1;
                    } while (uVar25 != 0);
                  }
                  if (uVar21 == 0) {
                    return;
                  }
                  __s_00 = (float *)(*ctx->malloc)((int)((ulong)uVar21 << 4),ctx->malloc_data);
                  if (__s_00 == (float *)0x0) {
                    ctx->isfail = 1;
                    ctx->out_of_memory = 1;
                  }
                  pMVar17->registers = __s_00;
                  memset(__s_00,0,(ulong)uVar21 << 4);
                  pMVar17->register_count = uVar21;
                  return;
                }
                uVar21 = *local_88;
                uVar13 = uVar21 >> 0x10;
                if (uVar13 < 0x2050) {
                  if (uVar13 < 0x1090) {
                    if (uVar13 < 0x1050) {
                      if (uVar13 < 0x1030) {
                        MVar30 = MOJOSHADER_PRESHADEROP_MOV;
                        if (uVar13 != 0x1000) {
                          if (uVar13 != 0x1010) goto LAB_0010c30b;
                          MVar30 = MOJOSHADER_PRESHADEROP_NEG;
                        }
                      }
                      else if (uVar13 == 0x1030) {
                        MVar30 = MOJOSHADER_PRESHADEROP_RCP;
                      }
                      else {
                        if (uVar13 != 0x1040) goto LAB_0010c30b;
                        MVar30 = MOJOSHADER_PRESHADEROP_FRC;
                      }
                    }
                    else if (uVar13 < 0x1070) {
                      if (uVar13 == 0x1050) {
                        MVar30 = MOJOSHADER_PRESHADEROP_EXP;
                      }
                      else {
                        if (uVar13 != 0x1060) goto LAB_0010c30b;
                        MVar30 = MOJOSHADER_PRESHADEROP_LOG;
                      }
                    }
                    else if (uVar13 == 0x1070) {
                      MVar30 = MOJOSHADER_PRESHADEROP_RSQ;
                    }
                    else {
                      if (uVar13 != 0x1080) goto LAB_0010c30b;
                      MVar30 = MOJOSHADER_PRESHADEROP_SIN;
                    }
                  }
                  else if (uVar13 < 0x2000) {
                    if (uVar13 < 0x10b0) {
                      if (uVar13 == 0x1090) {
                        MVar30 = MOJOSHADER_PRESHADEROP_COS;
                      }
                      else if (uVar13 == 0x10a0) {
                        MVar30 = MOJOSHADER_PRESHADEROP_ASIN;
                      }
                      else {
LAB_0010c30b:
                        MVar30 = MOJOSHADER_PRESHADEROP_NOP;
                        failf(ctx,"%s","Unknown preshader opcode.");
                      }
                    }
                    else if (uVar13 == 0x10b0) {
                      MVar30 = MOJOSHADER_PRESHADEROP_ACOS;
                    }
                    else {
                      if (uVar13 != 0x10c0) goto LAB_0010c30b;
                      MVar30 = MOJOSHADER_PRESHADEROP_ATAN;
                    }
                  }
                  else if (uVar13 < 0x2020) {
                    if (uVar13 == 0x2000) {
                      MVar30 = MOJOSHADER_PRESHADEROP_MIN;
                    }
                    else {
                      if (uVar13 != 0x2010) goto LAB_0010c30b;
                      MVar30 = MOJOSHADER_PRESHADEROP_MAX;
                    }
                  }
                  else if (uVar13 == 0x2020) {
                    MVar30 = MOJOSHADER_PRESHADEROP_LT;
                  }
                  else if (uVar13 == 0x2030) {
                    MVar30 = MOJOSHADER_PRESHADEROP_GE;
                  }
                  else {
                    if (uVar13 != 0x2040) goto LAB_0010c30b;
                    MVar30 = MOJOSHADER_PRESHADEROP_ADD;
                  }
                }
                else if (uVar13 < 0xa010) {
                  if (uVar13 < 0x3010) {
                    if (uVar13 < 0x2080) {
                      if (uVar13 == 0x2050) {
                        MVar30 = MOJOSHADER_PRESHADEROP_MUL;
                      }
                      else {
                        if (uVar13 != 0x2060) goto LAB_0010c30b;
                        MVar30 = MOJOSHADER_PRESHADEROP_ATAN2;
                      }
                    }
                    else if (uVar13 == 0x2080) {
                      MVar30 = MOJOSHADER_PRESHADEROP_DIV;
                    }
                    else {
                      if (uVar13 != 0x3000) goto LAB_0010c30b;
                      MVar30 = MOJOSHADER_PRESHADEROP_CMP;
                    }
                  }
                  else if (uVar13 < 0x5020) {
                    if (uVar13 == 0x3010) {
                      MVar30 = MOJOSHADER_PRESHADEROP_MOVC;
                    }
                    else {
                      if (uVar13 != 0x5000) goto LAB_0010c30b;
                      MVar30 = MOJOSHADER_PRESHADEROP_DOT;
                    }
                  }
                  else if (uVar13 == 0x5020) {
                    MVar30 = MOJOSHADER_PRESHADEROP_NOISE;
                  }
                  else {
                    if (uVar13 != 0xa000) goto LAB_0010c30b;
                    MVar30 = MOJOSHADER_PRESHADEROP_MIN_SCALAR;
                  }
                }
                else if (uVar13 < 0xa050) {
                  if (uVar13 < 0xa030) {
                    if (uVar13 == 0xa010) {
                      MVar30 = MOJOSHADER_PRESHADEROP_MAX_SCALAR;
                    }
                    else {
                      if (uVar13 != 0xa020) goto LAB_0010c30b;
                      MVar30 = MOJOSHADER_PRESHADEROP_LT_SCALAR;
                    }
                  }
                  else if (uVar13 == 0xa030) {
                    MVar30 = MOJOSHADER_PRESHADEROP_GE_SCALAR;
                  }
                  else {
                    if (uVar13 != 0xa040) goto LAB_0010c30b;
                    MVar30 = MOJOSHADER_PRESHADEROP_ADD_SCALAR;
                  }
                }
                else if (uVar13 < 0xa080) {
                  if (uVar13 == 0xa050) {
                    MVar30 = MOJOSHADER_PRESHADEROP_MUL_SCALAR;
                  }
                  else {
                    if (uVar13 != 0xa060) goto LAB_0010c30b;
                    MVar30 = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR;
                  }
                }
                else if (uVar13 == 0xa080) {
                  MVar30 = MOJOSHADER_PRESHADEROP_DIV_SCALAR;
                }
                else if (uVar13 == 0xd000) {
                  MVar30 = MOJOSHADER_PRESHADEROP_DOT_SCALAR;
                }
                else {
                  if (uVar13 != 0xd020) goto LAB_0010c30b;
                  MVar30 = MOJOSHADER_PRESHADEROP_NOISE_SCALAR;
                }
                uVar29 = local_88[1];
                uVar13 = uVar29 + 1;
                local_68->opcode = MVar30;
                local_68->element_count = uVar21 & 0xff;
                local_68->operand_count = uVar13;
                local_88 = local_88 + 2;
                uVar21 = local_9c - 2;
                local_9c = uVar21;
                if (uVar21 < uVar13 * 3) {
                  failf(ctx,"%s","Bogus preshader FXLC block.");
                }
                else {
                  if (uVar13 != 0) {
                    pMVar31 = local_68->operands;
                    do {
                      uVar1 = local_88[2];
                      switch(local_88[1]) {
                      case 1:
                        if (pMVar17->literal_count < uVar1) {
                          pcVar24 = "Bogus preshader literal index.";
LAB_0010c5ad:
                          failf(ctx,"%s",pcVar24);
                        }
                        else {
                          pMVar31->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                        }
                        break;
                      case 2:
                        uVar22 = *local_88;
                        uVar14 = 0;
                        puVar20 = &pMVar12->register_count;
                        uVar15 = uVar14;
                        if (iVar11 != 0) {
                          do {
                            if (puVar20[-2] != MOJOSHADER_SYMREGSET_FLOAT4) {
                              __assert_fail("sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                            ,0x2ac8,
                                            "void parse_preshader(Context *, const uint32 *, uint32)"
                                           );
                            }
                            if ((puVar20[-1] * 4 <= uVar1) &&
                               (uVar15 = uVar14, uVar1 < (puVar20[-1] + *puVar20) * 4)) break;
                            uVar14 = uVar14 + 1;
                            puVar20 = puVar20 + 0xe;
                            uVar15 = iVar11;
                          } while (iVar11 != uVar14);
                        }
                        if (uVar15 == iVar11) {
                          failf(ctx,"%s","Bogus preshader input index.");
                        }
                        else {
                          pMVar31->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                          if (uVar22 != 0) {
                            pMVar31->array_register_count = uVar22;
                            puVar20 = (uint *)(*ctx->malloc)(uVar22 * 4,ctx->malloc_data);
                            if (puVar20 == (uint *)0x0) {
                              ctx->isfail = 1;
                              ctx->out_of_memory = 1;
                            }
                            pMVar31->array_registers = puVar20;
                            memset(puVar20,0,(ulong)(uVar22 * 4));
                            uVar22 = uVar22 + (uVar22 == 0);
                            puVar20 = pMVar31->array_registers;
                            uVar26 = 0;
                            puVar16 = local_88;
                            do {
                              puVar20[uVar26] = local_88[uVar26 * 2 + 4] >> 2;
                              puVar16 = puVar16 + 2;
                              uVar26 = uVar26 + 1;
                            } while (uVar22 != uVar26);
                            local_9c = local_9c + uVar22 * -2;
                            local_88 = puVar16;
                          }
                        }
                        break;
                      case 4:
                        pMVar31->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;
                        if (uVar27 == 0) {
                          uVar26 = 0;
                        }
                        else {
                          uVar22 = 1;
                          uVar19 = 0;
                          do {
                            if ((local_70[uVar22 - 1] * 4 <= uVar1) &&
                               (uVar26 = uVar19,
                               uVar1 < (local_70[uVar22 - 1] + local_70[uVar22]) * 4)) break;
                            uVar19 = uVar19 + 1;
                            uVar22 = uVar22 + 2;
                            uVar26 = uVar27;
                          } while (uVar27 != uVar19);
                        }
                        if ((bVar5) && ((uint)uVar26 == uVar25)) {
                          pcVar24 = "Bogus preshader output index.";
                          goto LAB_0010c5ad;
                        }
                        break;
                      case 7:
                        pMVar31->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                        if (pMVar17->temp_count <= uVar1) {
                          pMVar17->temp_count = uVar1 + 1;
                        }
                      }
                      pMVar31->index = uVar1;
                      local_88 = local_88 + 3;
                      local_9c = local_9c - 3;
                      pMVar31 = pMVar31 + 1;
                      bVar32 = uVar29 != 0;
                      uVar29 = uVar29 - 1;
                    } while (bVar32);
                  }
                  local_68 = local_68 + 1;
                }
                if (uVar21 < uVar13 * 3) {
                  return;
                }
              } while( true );
            }
            pcVar24 = "Bogus preshader FXLC block.";
          }
          failf(ctx,"%s",pcVar24);
          return;
        }
        pcVar24 = "No CLIT block in preshader.";
      }
      else {
        pcVar24 = "No FXLC block in preshader.";
      }
    }
    else {
      pcVar24 = "No CTAB block in preshader.";
    }
  }
LAB_0010ba71:
  failf(ctx,"%s",pcVar24);
  return;
}

Assistant:

static void parse_preshader(Context *ctx, const uint32 *tokens, uint32 tokcount)
{
#ifndef MOJOSHADER_EFFECT_SUPPORT
    fail(ctx, "Preshader found, but effect support is disabled!");
#else
    uint32 i;

    assert(ctx->have_preshader == 0);  // !!! FIXME: can you have more than one?
    ctx->have_preshader = 1;

    // !!! FIXME: I don't know what specific versions signify, but we need to
    // !!! FIXME:  save this to test against the CTAB version field, if
    // !!! FIXME:  nothing else.
    // !!! FIXME: 0x02 0x0? is probably the version (fx_2_?),
    // !!! FIXME:  and 0x4658 is the magic, like a real shader's version token.
    const uint32 version_magic = 0x46580000;
    const uint32 min_version = 0x00000200 | version_magic;
    const uint32 max_version = 0x00000201 | version_magic;
    const uint32 version = SWAP32(tokens[0]);
    if (version < min_version || version > max_version)
    {
        fail(ctx, "Unsupported preshader version.");
        return;  // fail because the shader will malfunction w/o this.
    } // if

    tokens++;
    tokcount--;

    // All sections of a preshader are packed into separate comment tokens,
    //  inside the containing comment token block. Find them all before
    //  we start, so we don't care about the order they appear in the file.
    PreshaderBlockInfo ctab = { 0, 0, 0 };
    PreshaderBlockInfo prsi = { 0, 0, 0 };
    PreshaderBlockInfo fxlc = { 0, 0, 0 };
    PreshaderBlockInfo clit = { 0, 0, 0 };

    while (tokcount > 0)
    {
        uint32 subtokcount = 0;
        if ( (!is_comment_token(ctx, *tokens, &subtokcount)) ||
             (subtokcount > tokcount) )
        {
            fail(ctx, "Bogus preshader data.");
            return;
        } // if

        tokens++;
        tokcount--;

        const uint32 *nexttokens = tokens + subtokcount;
        const uint32 nexttokcount = tokcount - subtokcount;

        if (subtokcount > 0)
        {
            switch (SWAP32(*tokens))
            {
                #define PRESHADER_BLOCK_CASE(id, var) \
                    case id##_ID: { \
                        if (var.seen) { \
                            fail(ctx, "Multiple " #id " preshader blocks."); \
                            return; \
                        } \
                        var.tokens = tokens; \
                        var.tokcount = subtokcount; \
                        var.seen = 1; \
                        break; \
                    }
                PRESHADER_BLOCK_CASE(CTAB, ctab);
                PRESHADER_BLOCK_CASE(PRSI, prsi);
                PRESHADER_BLOCK_CASE(FXLC, fxlc);
                PRESHADER_BLOCK_CASE(CLIT, clit);
                default: fail(ctx, "Bogus preshader section."); return;
                #undef PRESHADER_BLOCK_CASE
            } // switch
        } // if

        tokens = nexttokens;
        tokcount = nexttokcount;
    } // while

    if (!ctab.seen) { fail(ctx, "No CTAB block in preshader."); return; }
    if (!fxlc.seen) { fail(ctx, "No FXLC block in preshader."); return; }
    if (!clit.seen) { fail(ctx, "No CLIT block in preshader."); return; }
    // prsi.seen is optional, apparently.

    MOJOSHADER_preshader *preshader = (MOJOSHADER_preshader *)
                                    Malloc(ctx, sizeof (MOJOSHADER_preshader));
    if (preshader == NULL)
        return;

    memset(preshader, '\0', sizeof (MOJOSHADER_preshader));
    preshader->malloc = ctx->malloc;
    preshader->free = ctx->free;
    preshader->malloc_data = ctx->malloc_data;

    ctx->preshader = preshader;

    // Let's set up the constant literals first...
    if (clit.tokcount == 0)
        fail(ctx, "Bogus CLIT block in preshader.");
    else
    {
        const uint32 lit_count = SWAP32(clit.tokens[1]);
        if (lit_count > ((clit.tokcount - 2) / 2))
        {
            fail(ctx, "Bogus CLIT block in preshader.");
            return;
        } // if
        else if (lit_count > 0)
        {
            preshader->literal_count = (unsigned int) lit_count;
            assert(sizeof (double) == 8);  // just in case.
            const size_t len = sizeof (double) * lit_count;
            preshader->literals = (double *) Malloc(ctx, len);
            if (preshader->literals == NULL)
                return;  // oh well.
            const double *litptr = (const double *) (clit.tokens + 2);
            for (i = 0; i < lit_count; i++)
                preshader->literals[i] = SWAPDBL(litptr[i]);
        } // else if
    } // else

    // Parse out the PRSI block. This is used to map the output registers.
    uint32 output_map_count = 0;
    const uint32 *output_map = NULL;
    if (prsi.seen)
    {
        if (prsi.tokcount < 8)
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        //const uint32 first_output_reg = SWAP32(prsi.tokens[1]);
        // !!! FIXME: there are a lot of fields here I don't know about.
        // !!! FIXME:  maybe [2] and [3] are for int4 and bool registers?
        //const uint32 output_reg_count = SWAP32(prsi.tokens[4]);
        // !!! FIXME:  maybe [5] and [6] are for int4 and bool registers?
        output_map_count = SWAP32(prsi.tokens[7]);

        prsi.tokcount -= 8;
        prsi.tokens += 8;

        if (prsi.tokcount < ((output_map_count + 1) * 2))
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        output_map = prsi.tokens;
    } // if

    // Now we'll figure out the CTAB...
    CtabData ctabdata = { 0, 0, 0 };
    parse_constant_table(ctx, ctab.tokens - 1, ctab.tokcount * 4,
                         version, 0, &ctabdata);

    // preshader owns this now. Don't free it in this function.
    preshader->symbol_count = ctabdata.symbol_count;
    preshader->symbols = ctabdata.symbols;

    if (!ctabdata.have_ctab)
    {
        fail(ctx, "Bogus preshader CTAB data");
        return;
    } // if

    // The FXLC block has the actual instructions...
    uint32 opcode_count = SWAP32(fxlc.tokens[1]);

    const size_t len = sizeof (MOJOSHADER_preshaderInstruction) * opcode_count;
    preshader->instruction_count = (unsigned int) opcode_count;
    preshader->instructions = (MOJOSHADER_preshaderInstruction *) Malloc(ctx, len);
    if (preshader->instructions == NULL)
        return;
    memset(preshader->instructions, '\0', len);

    fxlc.tokens += 2;
    fxlc.tokcount -= 2;
    if (opcode_count > (fxlc.tokcount / 2))
    {
        fail(ctx, "Bogus preshader FXLC block.");
        return;
    } // if

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    while (opcode_count--)
    {
        const uint32 opcodetok = SWAP32(fxlc.tokens[0]);
        MOJOSHADER_preshaderOpcode opcode = MOJOSHADER_PRESHADEROP_NOP;
        switch ((opcodetok >> 16) & 0xFFFF)
        {
            case 0x1000: opcode = MOJOSHADER_PRESHADEROP_MOV; break;
            case 0x1010: opcode = MOJOSHADER_PRESHADEROP_NEG; break;
            case 0x1030: opcode = MOJOSHADER_PRESHADEROP_RCP; break;
            case 0x1040: opcode = MOJOSHADER_PRESHADEROP_FRC; break;
            case 0x1050: opcode = MOJOSHADER_PRESHADEROP_EXP; break;
            case 0x1060: opcode = MOJOSHADER_PRESHADEROP_LOG; break;
            case 0x1070: opcode = MOJOSHADER_PRESHADEROP_RSQ; break;
            case 0x1080: opcode = MOJOSHADER_PRESHADEROP_SIN; break;
            case 0x1090: opcode = MOJOSHADER_PRESHADEROP_COS; break;
            case 0x10A0: opcode = MOJOSHADER_PRESHADEROP_ASIN; break;
            case 0x10B0: opcode = MOJOSHADER_PRESHADEROP_ACOS; break;
            case 0x10C0: opcode = MOJOSHADER_PRESHADEROP_ATAN; break;
            case 0x2000: opcode = MOJOSHADER_PRESHADEROP_MIN; break;
            case 0x2010: opcode = MOJOSHADER_PRESHADEROP_MAX; break;
            case 0x2020: opcode = MOJOSHADER_PRESHADEROP_LT; break;
            case 0x2030: opcode = MOJOSHADER_PRESHADEROP_GE; break;
            case 0x2040: opcode = MOJOSHADER_PRESHADEROP_ADD; break;
            case 0x2050: opcode = MOJOSHADER_PRESHADEROP_MUL; break;
            case 0x2060: opcode = MOJOSHADER_PRESHADEROP_ATAN2; break;
            case 0x2080: opcode = MOJOSHADER_PRESHADEROP_DIV; break;
            case 0x3000: opcode = MOJOSHADER_PRESHADEROP_CMP; break;
            case 0x3010: opcode = MOJOSHADER_PRESHADEROP_MOVC; break;
            case 0x5000: opcode = MOJOSHADER_PRESHADEROP_DOT; break;
            case 0x5020: opcode = MOJOSHADER_PRESHADEROP_NOISE; break;
            case 0xA000: opcode = MOJOSHADER_PRESHADEROP_MIN_SCALAR; break;
            case 0xA010: opcode = MOJOSHADER_PRESHADEROP_MAX_SCALAR; break;
            case 0xA020: opcode = MOJOSHADER_PRESHADEROP_LT_SCALAR; break;
            case 0xA030: opcode = MOJOSHADER_PRESHADEROP_GE_SCALAR; break;
            case 0xA040: opcode = MOJOSHADER_PRESHADEROP_ADD_SCALAR; break;
            case 0xA050: opcode = MOJOSHADER_PRESHADEROP_MUL_SCALAR; break;
            case 0xA060: opcode = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR; break;
            case 0xA080: opcode = MOJOSHADER_PRESHADEROP_DIV_SCALAR; break;
            case 0xD000: opcode = MOJOSHADER_PRESHADEROP_DOT_SCALAR; break;
            case 0xD020: opcode = MOJOSHADER_PRESHADEROP_NOISE_SCALAR; break;
            default: fail(ctx, "Unknown preshader opcode."); break;
        } // switch

        uint32 operand_count = SWAP32(fxlc.tokens[1]) + 1;  // +1 for dest.

        inst->opcode = opcode;
        inst->element_count = (unsigned int) (opcodetok & 0xFF);
        inst->operand_count = (unsigned int) operand_count;

        fxlc.tokens += 2;
        fxlc.tokcount -= 2;
        if ((operand_count * 3) > fxlc.tokcount)
        {
            fail(ctx, "Bogus preshader FXLC block.");
            return;
        } // if

        MOJOSHADER_preshaderOperand *operand = inst->operands;
        while (operand_count--)
        {
            const unsigned int item = (unsigned int) SWAP32(fxlc.tokens[2]);

            // !!! FIXME: Is this used anywhere other than INPUT? -flibit
            const uint32 numarrays = SWAP32(fxlc.tokens[0]);
            switch (SWAP32(fxlc.tokens[1]))
            {
                case 1:  // literal from CLIT block.
                {
                    if (item > preshader->literal_count)
                    {
                        fail(ctx, "Bogus preshader literal index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                    break;
                } // case

                case 2:  // item from ctabdata.
                {
                    MOJOSHADER_symbol *sym = ctabdata.symbols;
                    const uint32 symcount = (uint32) ctabdata.symbol_count;
                    for (i = 0; i < symcount; i++, sym++)
                    {
                        const uint32 base = sym->register_index * 4;
                        const uint32 count = sym->register_count * 4;
                        assert(sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4);
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for
                    if (i == ctabdata.symbol_count)
                    {
                        fail(ctx, "Bogus preshader input index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                    if (numarrays > 0)
                    {
                        // malloc the array symbol name array
                        const uint32 siz = numarrays * sizeof (uint32);
                        operand->array_register_count = numarrays;
                        operand->array_registers = (uint32 *) Malloc(ctx, siz);
                        memset(operand->array_registers, '\0', siz);
                        // Get each register base, indicating the arrays used.
                        // !!! FIXME: fail if fxlc.tokcount*2 > numarrays ?
                        for (i = 0; i < numarrays; i++)
                        {
                            const uint32 jmp = SWAP32(fxlc.tokens[4]);
                            const uint32 bigjmp = (jmp >> 4) * 4;
                            const uint32 ltljmp = (jmp >> 2) & 3;
                            operand->array_registers[i] = bigjmp + ltljmp;
                            fxlc.tokens += 2;
                            fxlc.tokcount -= 2;
                        } // for
                    } // if
                    break;
                } // case

                case 4:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;

                    for (i = 0; i < output_map_count; i++)
                    {
                        const uint32 base = output_map[(i*2)] * 4;
                        const uint32 count = output_map[(i*2)+1] * 4;
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for

                    if (i == output_map_count)
                    {
                        if (prsi.seen)  // No PRSI tokens, no output map.
                            fail(ctx, "Bogus preshader output index.");
                    } // if

                    break;
                } // case

                case 7:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                    if (item >= preshader->temp_count)
                        preshader->temp_count = item + 1;
                    break;
                } // case
            } // switch

            operand->index = item;

            fxlc.tokens += 3;
            fxlc.tokcount -= 3;
            operand++;
        } // while

        inst++;
    } // while

    // Registers need to be vec4, round up to nearest 4
    preshader->temp_count = (preshader->temp_count + 3) & ~3;

    unsigned int largest = 0;
    const MOJOSHADER_symbol *sym = preshader->symbols;
    const uint32 symcount = (uint32) preshader->symbol_count;
    for (i = 0; i < symcount; i++, sym++)
    {
        const unsigned int val = sym->register_index + sym->register_count;
        if (val > largest)
            largest = val;
    } // for

    if (largest > 0)
    {
        const size_t len = largest * sizeof (float) * 4;
        preshader->registers = (float *) Malloc(ctx, len);
        memset(preshader->registers, '\0', len);
        preshader->register_count = largest;
    } // if
#endif
}